

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

void __thiscall ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial(ON_OBSOLETE_V5_DimRadial *this)

{
  wchar_t *text_value;
  ON_OBSOLETE_V5_DimRadial *this_local;
  
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b6fda8;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimDiameter;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kInLine;
  text_value = DefaultDiameterText();
  ON_OBSOLETE_V5_Annotation::SetTextValue(&this->super_ON_OBSOLETE_V5_Annotation,text_value);
  ON_OBSOLETE_V5_Annotation::SetTextFormula(&this->super_ON_OBSOLETE_V5_Annotation,(wchar_t *)0x0);
  ON_SimpleArray<ON_2dPoint>::Reserve
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,4);
  ON_SimpleArray<ON_2dPoint>::SetCount
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,4);
  ON_SimpleArray<ON_2dPoint>::Zero
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>);
  return;
}

Assistant:

ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial()
{
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
  SetTextValue(DefaultDiameterText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.Zero();
}